

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix4.cpp
# Opt level: O0

Matrix4 * __thiscall COLLADABU::Math::Matrix4::adjoint(Matrix4 *this)

{
  Matrix4 *this_00;
  Real in_RSI;
  Matrix4 *in_RDI;
  Real m33;
  Real RVar1;
  Real m03;
  Real RVar2;
  Real RVar3;
  Real m00;
  Real RVar4;
  Real RVar5;
  Real m20;
  Matrix4 *m;
  Real RVar6;
  Real RVar7;
  Real m31;
  Real RVar8;
  Matrix4 *m11;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  Matrix4 *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffd0;
  
  m11 = in_RDI;
  m33 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
              in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
              in_stack_ffffffffffffffd0);
  RVar1 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                in_stack_ffffffffffffffd0);
  RVar1 = -RVar1;
  m03 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
              in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
              in_stack_ffffffffffffffd0);
  RVar2 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                in_stack_ffffffffffffffd0);
  RVar2 = -RVar2;
  RVar3 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                in_stack_ffffffffffffffd0);
  RVar3 = -RVar3;
  m00 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
              in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
              in_stack_ffffffffffffffd0);
  RVar4 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(size_t)m00,
                in_stack_ffffffffffffffd0);
  this_00 = (Matrix4 *)((ulong)RVar4 ^ 0x8000000000000000);
  RVar5 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                in_stack_ffffffffffffffa8,(size_t)this_00,(size_t)m00,in_stack_ffffffffffffffd0);
  m20 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
              (size_t)RVar5,(size_t)this_00,(size_t)m00,in_stack_ffffffffffffffd0);
  RVar4 = MINOR(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)m20,(size_t)RVar5,
                (size_t)this_00,(size_t)m00,in_stack_ffffffffffffffd0);
  RVar4 = -RVar4;
  m = (Matrix4 *)
      MINOR(in_stack_ffffffffffffffc0,(size_t)RVar4,(size_t)m20,(size_t)RVar5,(size_t)this_00,
            (size_t)m00,in_stack_ffffffffffffffd0);
  RVar6 = MINOR(m,(size_t)RVar4,(size_t)m20,(size_t)RVar5,(size_t)this_00,(size_t)m00,
                in_stack_ffffffffffffffd0);
  RVar6 = -RVar6;
  RVar7 = MINOR(m,(size_t)RVar4,(size_t)m20,(size_t)RVar5,(size_t)this_00,(size_t)m00,
                in_stack_ffffffffffffffd0);
  RVar7 = -RVar7;
  m31 = MINOR(m,(size_t)RVar4,(size_t)m20,(size_t)RVar5,(size_t)this_00,(size_t)m00,(size_t)RVar7);
  RVar8 = MINOR(m,(size_t)RVar4,(size_t)m20,(size_t)RVar5,(size_t)this_00,(size_t)m00,(size_t)RVar7)
  ;
  RVar8 = -RVar8;
  RVar5 = MINOR(m,(size_t)RVar4,(size_t)m20,(size_t)RVar5,(size_t)this_00,(size_t)m00,(size_t)RVar7)
  ;
  Matrix4(this_00,m00,RVar3,RVar2,m03,RVar1,(Real)m11,in_RSI,RVar5,m20,RVar4,(Real)m,RVar6,RVar7,m31
          ,RVar8,m33);
  return in_RDI;
}

Assistant:

Matrix4 Matrix4::adjoint() const
        {
            return Matrix4( MINOR( *this, 1, 2, 3, 1, 2, 3 ),
                            -MINOR( *this, 0, 2, 3, 1, 2, 3 ),
                            MINOR( *this, 0, 1, 3, 1, 2, 3 ),
                            -MINOR( *this, 0, 1, 2, 1, 2, 3 ),

                            -MINOR( *this, 1, 2, 3, 0, 2, 3 ),
                            MINOR( *this, 0, 2, 3, 0, 2, 3 ),
                            -MINOR( *this, 0, 1, 3, 0, 2, 3 ),
                            MINOR( *this, 0, 1, 2, 0, 2, 3 ),

                            MINOR( *this, 1, 2, 3, 0, 1, 3 ),
                            -MINOR( *this, 0, 2, 3, 0, 1, 3 ),
                            MINOR( *this, 0, 1, 3, 0, 1, 3 ),
                            -MINOR( *this, 0, 1, 2, 0, 1, 3 ),

                            -MINOR( *this, 1, 2, 3, 0, 1, 2 ),
                            MINOR( *this, 0, 2, 3, 0, 1, 2 ),
                            -MINOR( *this, 0, 1, 3, 0, 1, 2 ),
                            MINOR( *this, 0, 1, 2, 0, 1, 2 ) );
        }